

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetRuntimeLinkLibrary
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *this_00;
  cmTarget *this_01;
  cmValue cVar1;
  cmValue cVar2;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  this_00 = this->Makefile;
  local_b0.View_._M_len = (size_t)&DAT_00000006;
  local_b0.View_._M_str = "CMAKE_";
  local_80.View_._M_str = (lang->_M_dataplus)._M_p;
  local_80.View_._M_len = lang->_M_string_length;
  cmStrCat<char[25]>(&local_d0,&local_b0,&local_80,(char (*) [25])0x67c92a);
  cVar1 = cmMakefile::GetDefinition(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((cVar1.Value == (string *)0x0) || ((cVar1.Value)->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    this_01 = this->Target;
    local_b0.View_._M_str = (lang->_M_dataplus)._M_p;
    local_b0.View_._M_len = lang->_M_string_length;
    local_80.View_._M_len = 0x10;
    local_80.View_._M_str = "_RUNTIME_LIBRARY";
    cmStrCat<>(&local_d0,&local_b0,&local_80);
    cVar2 = cmTarget::GetProperty(this_01,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (cVar2.Value != (string *)0x0) {
      cVar1 = cVar2;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)cVar1.Value);
    local_80.View_._M_len = (size_t)local_80.Digits_;
    local_80.View_._M_str = (char *)0x0;
    local_80.Digits_[0] = '\0';
    cmGeneratorExpression::Evaluate
              ((string *)&local_b0,&local_50,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)&local_80);
    cmsys::SystemTools::UpperCase(__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetRuntimeLinkLibrary(
  std::string const& lang, std::string const& config) const
{
  // This is activated by the presence of a default selection whether or
  // not it is overridden by a property.
  cmValue runtimeLibraryDefault = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_RUNTIME_LIBRARY_DEFAULT"));
  if (!cmNonempty(runtimeLibraryDefault)) {
    return std::string();
  }
  cmValue runtimeLibraryValue =
    this->Target->GetProperty(cmStrCat(lang, "_RUNTIME_LIBRARY"));
  if (!runtimeLibraryValue) {
    runtimeLibraryValue = runtimeLibraryDefault;
  }
  return cmSystemTools::UpperCase(cmGeneratorExpression::Evaluate(
    *runtimeLibraryValue, this->LocalGenerator, config, this));
}